

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O0

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  const_iterator __position;
  const_iterator __position_00;
  undefined4 uVar1;
  iterator piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  InstOp IVar7;
  uchar *puVar8;
  int *piVar9;
  iterator piVar10;
  InstCond *pIVar11;
  ostream *poVar12;
  Prog *in_RDI;
  uint32_t newact_1;
  uint32_t act_1;
  int b_2;
  int c_1;
  Rune hi;
  Rune lo;
  uint32_t newact;
  uint32_t act;
  int b_1;
  int c;
  int nextindex;
  Inst *ip;
  uint32_t cond;
  int id_1;
  int nstack;
  bool matched;
  int b;
  OneState *node;
  int nodeindex;
  int id;
  iterator it;
  int nalloc;
  Instq workq;
  Instq tovisit;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nodes;
  PODArray<int> nodebyid;
  int size;
  PODArray<re2::InstCond> stack;
  int stacksize;
  int statesize;
  int maxnodes;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  Prog *in_stack_fffffffffffffb40;
  LogMessage *in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb5c;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  EmptyOp in_stack_fffffffffffffb70;
  InstOp in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  InstOp in_stack_fffffffffffffb80;
  EmptyOp in_stack_fffffffffffffb84;
  undefined1 local_310 [87];
  undefined1 local_2b9;
  uchar *local_2b8;
  int local_2a4;
  LogMessage local_2a0;
  Inst *local_120;
  EmptyOp local_114;
  int local_110;
  int local_10c;
  byte local_105;
  int local_104;
  OneState *local_100;
  int local_f8;
  int local_f4;
  iterator local_f0;
  uchar *local_e8;
  undefined1 local_d9;
  uchar *local_d8;
  int local_c4;
  SparseSetT<void> local_c0 [3];
  int local_34;
  int local_1c;
  int local_18;
  int local_14;
  byte local_1;
  
  if ((in_RDI->did_onepass_ & 1U) == 0) {
    in_RDI->did_onepass_ = true;
    iVar4 = start(in_RDI);
    if (iVar4 == 0) {
      local_1 = 0;
    }
    else {
      local_14 = inst_count(in_RDI,kInstByteRange);
      local_14 = local_14 + 2;
      iVar4 = bytemap_range(in_RDI);
      local_18 = iVar4 * 4 + 4;
      if ((local_14 < 65000) && ((long)local_14 <= (in_RDI->dfa_mem_ / 4) / (long)local_18)) {
        iVar4 = inst_count(in_RDI,kInstCapture);
        iVar5 = inst_count(in_RDI,kInstEmptyWidth);
        iVar6 = inst_count(in_RDI,kInstNop);
        local_1c = iVar6 + 1 + iVar4 + iVar5;
        PODArray<re2::InstCond>::PODArray
                  ((PODArray<re2::InstCond> *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   in_stack_fffffffffffffb5c);
        local_34 = Prog::size(in_RDI);
        PODArray<int>::PODArray
                  ((PODArray<int> *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   in_stack_fffffffffffffb5c);
        piVar9 = PODArray<int>::data((PODArray<int> *)0x24f894);
        memset(piVar9,0xff,(long)local_34 << 2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x24f8c9);
        SparseSetT<void>::SparseSetT
                  ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                   ,in_stack_fffffffffffffb5c);
        SparseSetT<void>::SparseSetT
                  ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                   ,in_stack_fffffffffffffb5c);
        start(in_RDI);
        AddQ((Instq *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0);
        start(in_RDI);
        piVar9 = PODArray<int>::operator[]
                           ((PODArray<int> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
        *piVar9 = 0;
        local_c4 = 1;
        local_d8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)
                                      );
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffb40,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        local_d9 = 0;
        __position._M_current._4_4_ = in_stack_fffffffffffffb7c;
        __position._M_current._0_4_ = in_stack_fffffffffffffb78;
        local_e8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                                       ,__position,
                                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
                                       ,(value_type_conflict1 *)
                                        CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60
                                                ));
        for (local_f0 = SparseSetT<void>::begin((SparseSetT<void> *)0x24f9f4); piVar2 = local_f0,
            piVar10 = SparseSetT<void>::end((SparseSetT<void> *)in_stack_fffffffffffffb40),
            piVar2 != piVar10; local_f0 = local_f0 + 1) {
          local_f4 = *local_f0;
          piVar9 = PODArray<int>::operator[]
                             ((PODArray<int> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
          local_f8 = *piVar9;
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x24fa9b);
          local_100 = IndexToNode(puVar8,local_18,local_f8);
          for (local_104 = 0; local_104 < in_RDI->bytemap_range_; local_104 = local_104 + 1) {
            local_100[(long)local_104 + 1].matchcond = 0x30;
          }
          local_100->matchcond = 0x30;
          SparseSetT<void>::clear(local_c0);
          iVar4 = local_f4;
          local_105 = 0;
          local_10c = 0;
          pIVar11 = PODArray<re2::InstCond>::operator[]
                              ((PODArray<re2::InstCond> *)in_stack_fffffffffffffb40,
                               in_stack_fffffffffffffb3c);
          pIVar11->id = iVar4;
          local_10c = local_10c + 1;
          pIVar11 = PODArray<re2::InstCond>::operator[]
                              ((PODArray<re2::InstCond> *)in_stack_fffffffffffffb40,
                               in_stack_fffffffffffffb3c);
          pIVar11->cond = 0;
LAB_0024fc3b:
          if (0 < local_10c) {
            local_10c = local_10c + -1;
            pIVar11 = PODArray<re2::InstCond>::operator[]
                                ((PODArray<re2::InstCond> *)in_stack_fffffffffffffb40,
                                 in_stack_fffffffffffffb3c);
            local_110 = pIVar11->id;
            pIVar11 = PODArray<re2::InstCond>::operator[]
                                ((PODArray<re2::InstCond> *)in_stack_fffffffffffffb40,
                                 in_stack_fffffffffffffb3c);
            local_114 = pIVar11->cond;
LAB_0024fcb1:
            local_120 = inst(in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
            IVar7 = Inst::opcode(local_120);
            switch(IVar7) {
            case kInstAltMatch:
              bVar3 = AddQ((Instq *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0)
              ;
              if (bVar3) {
                local_110 = local_110 + 1;
                goto LAB_0024fcb1;
              }
              break;
            case kInstByteRange:
              Inst::out(local_120);
              piVar9 = PODArray<int>::operator[]
                                 ((PODArray<int> *)in_stack_fffffffffffffb40,
                                  in_stack_fffffffffffffb3c);
              local_2a4 = *piVar9;
              if (local_2a4 == -1) {
                if (local_14 <= local_c4) break;
                local_2a4 = local_c4;
                Inst::out(local_120);
                AddQ((Instq *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0);
                iVar4 = local_c4;
                Inst::out(local_120);
                piVar9 = PODArray<int>::operator[]
                                   ((PODArray<int> *)in_stack_fffffffffffffb40,
                                    in_stack_fffffffffffffb3c);
                *piVar9 = iVar4;
                local_c4 = local_c4 + 1;
                local_2b8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                               ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)CONCAT44(in_stack_fffffffffffffb3c,
                                                            in_stack_fffffffffffffb38));
                __gnu_cxx::
                __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::__normal_iterator<unsigned_char*>
                          ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffffb40,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                local_2b9 = 0;
                __position_00._M_current._4_4_ = in_stack_fffffffffffffb7c;
                __position_00._M_current._0_4_ = in_stack_fffffffffffffb78;
                local_310._72_8_ =
                     std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                                __position_00,
                                CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                (value_type_conflict1 *)
                                CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
                puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    0x24ffab);
                local_100 = IndexToNode(puVar8,local_18,local_f8);
              }
              for (local_310._68_4_ = Inst::lo(local_120); uVar1 = local_310._68_4_,
                  iVar4 = Inst::hi(local_120), (int)uVar1 <= iVar4;
                  local_310._68_4_ = local_310._68_4_ + 1) {
                local_310._64_4_ = ZEXT14(in_RDI->bytemap_[(int)local_310._68_4_]);
                while( true ) {
                  bVar3 = false;
                  if ((int)local_310._68_4_ < 0xff) {
                    bVar3 = (uint)in_RDI->bytemap_[local_310._68_4_ + 1] == local_310._64_4_;
                  }
                  if (!bVar3) break;
                  local_310._68_4_ = local_310._68_4_ + 1;
                }
                local_310._60_4_ = local_100[(long)(int)local_310._64_4_ + 1].matchcond;
                local_310._56_4_ = local_2a4 << 0x10 | local_114;
                if ((local_105 & 1) != 0) {
                  local_310._56_4_ = local_310._56_4_ | 0x40;
                }
                if ((local_310._60_4_ & (kEmptyNonWordBoundary|kEmptyWordBoundary)) ==
                    (kEmptyNonWordBoundary|kEmptyWordBoundary)) {
                  local_100[(long)(int)local_310._64_4_ + 1].matchcond = local_310._56_4_;
                }
                else if (local_310._60_4_ != local_310._56_4_) goto LAB_00250726;
              }
              iVar4 = Inst::foldcase(local_120);
              if (iVar4 != 0) {
                local_310._48_4_ = Inst::lo(local_120);
                local_310._44_4_ = 0x61;
                piVar9 = std::max<int>((int *)(local_310 + 0x30),(int *)(local_310 + 0x2c));
                local_310._52_4_ = *piVar9 + -0x20;
                local_310._36_4_ = Inst::hi(local_120);
                local_310._32_4_ = 0x7a;
                piVar9 = std::min<int>((int *)(local_310 + 0x24),(int *)(local_310 + 0x20));
                local_310._40_4_ = *piVar9 + -0x20;
                for (local_310._28_4_ = local_310._52_4_;
                    (int)local_310._28_4_ <= (int)local_310._40_4_;
                    local_310._28_4_ = local_310._28_4_ + 1) {
                  local_310._24_4_ = ZEXT14(in_RDI->bytemap_[(int)local_310._28_4_]);
                  while( true ) {
                    bVar3 = false;
                    if ((int)local_310._28_4_ < 0xff) {
                      bVar3 = (uint)in_RDI->bytemap_[local_310._28_4_ + 1] == local_310._24_4_;
                    }
                    if (!bVar3) break;
                    local_310._28_4_ = local_310._28_4_ + 1;
                  }
                  local_310._20_4_ = local_100[(long)(int)local_310._24_4_ + 1].matchcond;
                  local_310._16_4_ = local_2a4 << 0x10 | local_114;
                  if ((local_105 & 1) != 0) {
                    local_310._16_4_ = local_310._16_4_ | 0x40;
                  }
                  if ((local_310._20_4_ & (kEmptyNonWordBoundary|kEmptyWordBoundary)) ==
                      (kEmptyNonWordBoundary|kEmptyWordBoundary)) {
                    local_100[(long)(int)local_310._24_4_ + 1].matchcond = local_310._16_4_;
                  }
                  else if (local_310._20_4_ != local_310._16_4_) goto LAB_00250726;
                }
              }
              iVar4 = Inst::last(local_120);
              if (iVar4 != 0) goto LAB_0024fc3b;
              bVar3 = AddQ((Instq *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0)
              ;
              if (bVar3) {
                local_110 = local_110 + 1;
                goto LAB_0024fcb1;
              }
              break;
            case kInstCapture:
            case kInstEmptyWidth:
            case kInstNop:
              iVar4 = Inst::last(local_120);
              if (iVar4 == 0) {
                bVar3 = AddQ((Instq *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                             0);
                if (!bVar3) break;
                iVar4 = local_110 + 1;
                pIVar11 = PODArray<re2::InstCond>::operator[]
                                    ((PODArray<re2::InstCond> *)in_stack_fffffffffffffb40,
                                     in_stack_fffffffffffffb3c);
                pIVar11->id = iVar4;
                local_10c = local_10c + 1;
                in_stack_fffffffffffffb84 = local_114;
                pIVar11 = PODArray<re2::InstCond>::operator[]
                                    ((PODArray<re2::InstCond> *)in_stack_fffffffffffffb40,
                                     in_stack_fffffffffffffb3c);
                pIVar11->cond = in_stack_fffffffffffffb84;
              }
              in_stack_fffffffffffffb80 = Inst::opcode(local_120);
              if ((in_stack_fffffffffffffb80 == kInstCapture) &&
                 (in_stack_fffffffffffffb7c = Inst::cap(local_120), in_stack_fffffffffffffb7c < 10))
              {
                in_stack_fffffffffffffb78 = Inst::cap(local_120);
                local_114 = 0x20 << ((byte)in_stack_fffffffffffffb78 & 0x1f) | local_114;
              }
              in_stack_fffffffffffffb74 = Inst::opcode(local_120);
              if (in_stack_fffffffffffffb74 == kInstEmptyWidth) {
                in_stack_fffffffffffffb70 = Inst::empty(local_120);
                local_114 = in_stack_fffffffffffffb70 | local_114;
              }
              in_stack_fffffffffffffb6c = Inst::out(local_120);
              bVar3 = AddQ((Instq *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0)
              ;
              in_stack_fffffffffffffb68 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffb68);
              if (bVar3) {
                in_stack_fffffffffffffb64 = Inst::out(local_120);
                local_110 = in_stack_fffffffffffffb64;
                goto LAB_0024fcb1;
              }
              break;
            case kInstMatch:
              if ((local_105 & 1) != 0) break;
              local_105 = 1;
              local_100->matchcond = local_114;
              in_stack_fffffffffffffb60 = Inst::last(local_120);
              if (in_stack_fffffffffffffb60 != 0) goto LAB_0024fc3b;
              bVar3 = AddQ((Instq *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),0)
              ;
              in_stack_fffffffffffffb5c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffb5c);
              if (!bVar3) break;
              local_110 = local_110 + 1;
              goto LAB_0024fcb1;
            case kInstFail:
              goto switchD_0024fd23_caseD_7;
            default:
              LogMessage::LogMessage
                        ((LogMessage *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                         ,(char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                         in_stack_fffffffffffffb74);
              poVar12 = LogMessage::stream(&local_2a0);
              poVar12 = std::operator<<(poVar12,"unhandled opcode: ");
              IVar7 = Inst::opcode(local_120);
              std::ostream::operator<<(poVar12,IVar7);
              LogMessage::~LogMessage(in_stack_fffffffffffffb50);
              goto LAB_0024fc3b;
            }
LAB_00250726:
            local_1 = 0;
            goto LAB_00250739;
          }
        }
        in_RDI->dfa_mem_ = in_RDI->dfa_mem_ - (long)(local_c4 * local_18);
        PODArray<unsigned_char>::PODArray
                  ((PODArray<unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   in_stack_fffffffffffffb5c);
        in_stack_fffffffffffffb40 = (Prog *)local_310;
        PODArray<unsigned_char>::operator=
                  ((PODArray<unsigned_char> *)in_stack_fffffffffffffb40,
                   (PODArray<unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        PODArray<unsigned_char>::~PODArray((PODArray<unsigned_char> *)0x2506d4);
        in_stack_fffffffffffffb50 =
             (LogMessage *)PODArray<unsigned_char>::data((PODArray<unsigned_char> *)0x2506de);
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2506f2);
        memmove(in_stack_fffffffffffffb50,puVar8,(long)(local_c4 * local_18));
        local_1 = 1;
LAB_00250739:
        SparseSetT<void>::~SparseSetT((SparseSetT<void> *)in_stack_fffffffffffffb40);
        SparseSetT<void>::~SparseSetT((SparseSetT<void> *)in_stack_fffffffffffffb40);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb50);
        PODArray<int>::~PODArray((PODArray<int> *)0x25076d);
        PODArray<re2::InstCond>::~PODArray((PODArray<re2::InstCond> *)0x25077a);
      }
      else {
        local_1 = 0;
      }
    }
  }
  else {
    puVar8 = PODArray<unsigned_char>::data((PODArray<unsigned_char> *)0x24f716);
    local_1 = puVar8 != (uchar *)0x0;
  }
  return (bool)(local_1 & 1);
switchD_0024fd23_caseD_7:
  goto LAB_0024fc3b;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_nodes_.data() != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  PODArray<InstCond> stack(stacksize);

  int size = this->size();
  PODArray<int> nodebyid(size);  // indexed by ip
  memset(nodebyid.data(), 0xFF, size*sizeof nodebyid[0]);

  // Originally, nodes was a uint8_t[maxnodes*statesize], but that was
  // unnecessarily optimistic: why allocate a large amount of memory
  // upfront for a large program when it is unlikely to be one-pass?
  std::vector<uint8_t> nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  int nalloc = 1;
  nodes.insert(nodes.end(), statesize, 0);
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32_t cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d >= %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            AddQ(&tovisit, ip->out());
            nodebyid[ip->out()] = nalloc;
            nalloc++;
            nodes.insert(nodes.end(), statesize, 0);
            // Update node because it might have been invalidated.
            node = IndexToNode(nodes.data(), statesize, nodeindex);
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32_t act = node->action[b];
            uint32_t newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (ExtraDebug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = std::max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = std::min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32_t act = node->action[b];
              uint32_t newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (ExtraDebug)
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d\n", *it, ip->out());
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (ExtraDebug)
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d\n", *it);
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (ExtraDebug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    std::map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    std::string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes.data(), statesize, nodeindex);
      dump += StringPrintf("node %d id=%d: matchcond=%#x\n",
                           nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        dump += StringPrintf("  %d cond %#x -> %d id=%d\n",
                             i, node->action[i] & 0xFFFF,
                             node->action[i] >> kIndexShift,
                             idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  dfa_mem_ -= nalloc*statesize;
  onepass_nodes_ = PODArray<uint8_t>(nalloc*statesize);
  memmove(onepass_nodes_.data(), nodes.data(), nalloc*statesize);
  return true;

fail:
  return false;
}